

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O2

int LZWPreEncode(TIFF *tif,uint16_t s)

{
  LZWCodecState *sp;
  
  sp = (LZWCodecState *)tif->tif_data;
  if (sp != (LZWCodecState *)0x0) {
    if (sp->enc_hashtab == (hash_t *)0x0) {
      (*tif->tif_setupencode)(tif);
    }
    (sp->base).nbits = 9;
    (sp->base).maxcode = 0x1ff;
    (sp->base).free_ent = 0x102;
    (sp->base).nextdata = 0;
    (sp->base).nextbits = 0;
    sp->enc_checkpoint = 10000;
    sp->enc_ratio = 0;
    sp->enc_incount = 0;
    sp->enc_outcount = 0;
    sp->enc_rawlimit = tif->tif_rawdata + tif->tif_rawdatasize + -5;
    cl_hash(sp);
    sp->enc_oldcode = 0xffff;
    return 1;
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                ,0x419,"int LZWPreEncode(TIFF *, uint16_t)");
}

Assistant:

static int LZWPreEncode(TIFF *tif, uint16_t s)
{
    LZWCodecState *sp = EncoderState(tif);

    (void)s;
    assert(sp != NULL);

    if (sp->enc_hashtab == NULL)
    {
        tif->tif_setupencode(tif);
    }

    sp->lzw_nbits = BITS_MIN;
    sp->lzw_maxcode = MAXCODE(BITS_MIN);
    sp->lzw_free_ent = CODE_FIRST;
    sp->lzw_nextbits = 0;
    sp->lzw_nextdata = 0;
    sp->enc_checkpoint = CHECK_GAP;
    sp->enc_ratio = 0;
    sp->enc_incount = 0;
    sp->enc_outcount = 0;
    /*
     * The 4 here insures there is space for 2 max-sized
     * codes in LZWEncode and LZWPostDecode.
     */
    sp->enc_rawlimit = tif->tif_rawdata + tif->tif_rawdatasize - 1 - 4;
    cl_hash(sp);                   /* clear hash table */
    sp->enc_oldcode = (hcode_t)-1; /* generates CODE_CLEAR in LZWEncode */
    return (1);
}